

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlDocument::TiXmlDocument(TiXmlDocument *this,char *documentName)

{
  char *documentName_local;
  TiXmlDocument *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,DOCUMENT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDocument_0026f958;
  TiXmlString::TiXmlString(&this->errorDesc);
  TiXmlCursor::TiXmlCursor(&this->errorLocation);
  this->tabsize = 4;
  this->useMicrosoftBOM = false;
  TiXmlString::operator=(&(this->super_TiXmlNode).value,documentName);
  ClearError(this);
  return;
}

Assistant:

TiXmlDocument::TiXmlDocument(const char * documentName) :
	TiXmlNode(TiXmlNode::DOCUMENT) {
	tabsize = 4;
	useMicrosoftBOM = false;
	value = documentName;
	ClearError();
}